

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  IReporterFactory *pIVar1;
  IStreamingReporter *pIVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 auVar5 [8];
  undefined1 local_78 [8];
  Listeners listeners;
  undefined8 local_50;
  IConfig *local_48;
  long *local_40;
  Ptr<Catch::IStreamingReporter> local_38;
  
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])(pIVar4);
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar3));
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
            *)local_78,__x);
  listeners.
  super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       listeners.
       super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_78 !=
      (undefined1  [8])
      listeners.
      super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar5 = local_78;
    do {
      pIVar1 = ((pointer)auVar5)->m_p;
      iVar3 = (*(config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
      local_50 = CONCAT44(extraout_var_00,iVar3);
      local_48 = config->m_p;
      if (local_48 != (IConfig *)0x0) {
        (*(local_48->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
      }
      iVar3 = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar1,&local_50);
      local_38.m_p = (IStreamingReporter *)CONCAT44(extraout_var_01,iVar3);
      if (local_38.m_p != (IStreamingReporter *)0x0) {
        (*((local_38.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_38.m_p);
      }
      addReporter((Catch *)&local_40,reporters,&local_38);
      Ptr<Catch::IStreamingReporter>::operator=
                (reporters,(Ptr<Catch::IStreamingReporter> *)&local_40);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 0x18))();
      }
      if (local_38.m_p != (IStreamingReporter *)0x0) {
        (*((local_38.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      if (local_48 != (IConfig *)0x0) {
        (*(local_48->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
      }
      auVar5 = (undefined1  [8])((long)auVar5 + 8);
    } while (auVar5 != (undefined1  [8])
                       listeners.
                       super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pIVar2 = reporters->m_p;
  *(IStreamingReporter **)this = pIVar2;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             *)local_78);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }